

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightLeSample * __thiscall
pbrt::SpotLight::SampleLe
          (LightLeSample *__return_storage_ptr__,SpotLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  undefined1 auVar1 [16];
  int iVar2;
  Float FVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar12 [56];
  undefined1 auVar7 [64];
  undefined1 auVar13 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar11 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  span<const_float> weights;
  SampledSpectrum SVar17;
  Vector3f VVar18;
  Float sectionPDF;
  Float local_ac;
  Tuple3<pbrt::Vector3,_float> local_a8;
  Float p [2];
  SampledSpectrum local_90;
  Ray local_80;
  Ray ray;
  undefined1 extraout_var [60];
  
  p[0] = 1.0 - this->cosFalloffStart;
  auVar12 = SUB6056((undefined1  [60])0x0,4);
  p[1] = (this->cosFalloffStart - this->cosFalloffEnd) * 0.5;
  weights.n = (size_t)&sectionPDF;
  weights.ptr = (float *)0x2;
  iVar2 = SampleDiscrete((pbrt *)p,weights,(u2->super_Tuple2<pbrt::Point2,_float>).x,(Float *)0x0,
                         (Float *)lambda);
  if (iVar2 == 0) {
    auVar13 = (undefined1  [56])0x0;
    VVar18 = SampleUniformCone(u1,this->cosFalloffStart);
    local_a8.z = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar8._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_56_ = auVar13;
    local_a8._0_8_ = vmovlps_avx(auVar8._0_16_);
    fVar4 = (1.0 / ((1.0 - this->cosFalloffStart) * 6.2831855)) * sectionPDF;
  }
  else {
    auVar6._0_4_ = SampleSmoothStep((u1->super_Tuple2<pbrt::Point2,_float>).x,this->cosFalloffEnd,
                                    this->cosFalloffStart);
    auVar6._4_60_ = extraout_var;
    if ((auVar6._0_4_ < this->cosFalloffEnd) || (this->cosFalloffStart < auVar6._0_4_)) {
      LogFatal<char_const(&)[57]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
                 ,0x4f8,"Check failed: %s",
                 (char (*) [57])"cosTheta >= cosFalloffEnd && cosTheta <= cosFalloffStart");
    }
    auVar1 = vfnmadd213ss_fma(auVar6._0_16_,auVar6._0_16_,ZEXT416(0x3f800000));
    auVar5._0_12_ = ZEXT812(0);
    auVar5._12_4_ = 0;
    auVar1 = vmaxss_avx(auVar1,auVar5);
    fVar4 = (u1->super_Tuple2<pbrt::Point2,_float>).y;
    auVar1 = vsqrtss_avx(auVar1,auVar1);
    auVar12 = ZEXT856(auVar1._8_8_);
    VVar18 = SphericalDirection(auVar1._0_4_,auVar6._0_4_,(fVar4 + fVar4) * 3.1415927);
    local_a8.z = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar7._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar12;
    local_a8._0_8_ = vmovlps_avx(auVar7._0_16_);
    auVar12 = (undefined1  [56])0x0;
    local_ac = sectionPDF;
    FVar3 = SmoothStepPDF(auVar6._0_4_,this->cosFalloffEnd,this->cosFalloffStart);
    fVar4 = (FVar3 * local_ac) / 6.2831855;
  }
  local_80.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(this->super_LightBase).mediumInterface.outside.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  local_80.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_80.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_80.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_80.d.super_Tuple3<pbrt::Vector3,_float>.x = local_a8.x;
  local_80.d.super_Tuple3<pbrt::Vector3,_float>.y = local_a8.y;
  local_80.d.super_Tuple3<pbrt::Vector3,_float>.z = local_a8.z;
  local_80.time = time;
  Transform::operator()(&ray,&(this->super_LightBase).renderFromLight,&local_80,(Float *)0x0);
  FVar3 = this->scale;
  auVar13 = (undefined1  [56])0x0;
  SVar17 = DenselySampledSpectrum::Sample(&this->I,lambda);
  auVar14._0_8_ = SVar17.values.values._8_8_;
  auVar14._8_56_ = auVar12;
  auVar9._0_8_ = SVar17.values.values._0_8_;
  auVar9._8_56_ = auVar13;
  local_90.values.values = (array<float,_4>)vmovlhps_avx(auVar9._0_16_,auVar14._0_16_);
  auVar13 = (undefined1  [56])0x0;
  SVar17 = SampledSpectrum::operator*(&local_90,FVar3);
  auVar15._0_8_ = SVar17.values.values._8_8_;
  auVar15._8_56_ = auVar12;
  auVar10._0_8_ = SVar17.values.values._0_8_;
  auVar10._8_56_ = auVar13;
  auVar1 = vmovlhps_avx(auVar10._0_16_,auVar15._0_16_);
  local_80.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar1._0_8_;
  local_80.o.super_Tuple3<pbrt::Point3,_float>.z = auVar1._8_4_;
  local_80.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar1._12_4_;
  FVar3 = Falloff(this,(Vector3f *)&local_a8);
  auVar13 = extraout_var_00;
  SVar17 = SampledSpectrum::operator*((SampledSpectrum *)&local_80,FVar3);
  auVar16._0_8_ = SVar17.values.values._8_8_;
  auVar16._8_56_ = auVar12;
  auVar11._0_8_ = SVar17.values.values._0_8_;
  auVar11._8_56_ = auVar13;
  auVar1 = vmovlhps_avx(auVar11._0_16_,auVar16._0_16_);
  *(undefined1 (*) [16])(__return_storage_ptr__->L).values.values = auVar1;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x =
       ray.o.super_Tuple3<pbrt::Point3,_float>.x;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       ray.o.super_Tuple3<pbrt::Point3,_float>.y;
  *(ulong *)&(__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       CONCAT44(ray.d.super_Tuple3<pbrt::Vector3,_float>.x,ray.o.super_Tuple3<pbrt::Point3,_float>.z
               );
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
       ray.d.super_Tuple3<pbrt::Vector3,_float>.x;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       ray.d.super_Tuple3<pbrt::Vector3,_float>.y;
  *(undefined8 *)&(__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = ray._20_8_;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (uintptr_t)
          ray.medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  (__return_storage_ptr__->intr).set = false;
  __return_storage_ptr__->pdfPos = 1.0;
  __return_storage_ptr__->pdfDir = fVar4;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample SpotLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                  SampledWavelengths &lambda, Float time) const {
    // Unnormalized probabilities of sampling each part.
    Float p[2] = {1 - cosFalloffStart, (cosFalloffStart - cosFalloffEnd) / 2};
    Float sectionPDF;
    Vector3f wl;
    int section = SampleDiscrete(p, u2[0], &sectionPDF);
    Float pdfDir;
    if (section == 0) {
        // Sample center cone
        wl = SampleUniformCone(u1, cosFalloffStart);
        pdfDir = sectionPDF * UniformConePDF(cosFalloffStart);
    } else {
        DCHECK_EQ(1, section);

        Float cosTheta = SampleSmoothStep(u1[0], cosFalloffEnd, cosFalloffStart);
        CHECK(cosTheta >= cosFalloffEnd && cosTheta <= cosFalloffStart);
        Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
        Float phi = u1[1] * 2 * Pi;
        wl = SphericalDirection(sinTheta, cosTheta, phi);
        pdfDir = sectionPDF * SmoothStepPDF(cosTheta, cosFalloffEnd, cosFalloffStart) /
                 (2 * Pi);
    }

    Ray ray = renderFromLight(Ray(Point3f(0, 0, 0), wl, time, mediumInterface.outside));
    return LightLeSample(scale * I.Sample(lambda) * Falloff(wl), ray, 1, pdfDir);
}